

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int secp256r1_create_key_exchange(ptls_key_exchange_context_t **ctx,ptls_iovec_t *pubkey)

{
  EC_GROUP *group;
  size_t sVar1;
  bool bVar2;
  st_x9_62_keyex_context_t *ctx_00;
  BN_CTX *pBVar3;
  EC_GROUP *group_00;
  EC_KEY *key;
  EC_POINT *point;
  int iVar4;
  ptls_iovec_t pVar5;
  
  ctx_00 = (st_x9_62_keyex_context_t *)malloc(0x30);
  iVar4 = 0x201;
  if (ctx_00 != (st_x9_62_keyex_context_t *)0x0) {
    ctx_00->privkey = (EC_KEY *)0x0;
    (ctx_00->pubkey).base = (uint8_t *)0x0;
    ctx_00->bn_ctx = (BN_CTX *)0x0;
    ctx_00->group = (EC_GROUP *)0x0;
    (ctx_00->pubkey).len = 0;
    (ctx_00->super).on_exchange = x9_62_on_exchange;
    pBVar3 = BN_CTX_new();
    ctx_00->bn_ctx = (BN_CTX *)pBVar3;
    if (pBVar3 != (BN_CTX *)0x0) {
      group_00 = EC_GROUP_new_by_curve_name(0x19f);
      ctx_00->group = (EC_GROUP *)group_00;
      if (group_00 != (EC_GROUP *)0x0) {
        key = ecdh_gerenate_key((EC_GROUP *)group_00);
        ctx_00->privkey = key;
        if (key != (EC_KEY *)0x0) {
          group = ctx_00->group;
          point = EC_KEY_get0_public_key((EC_KEY *)key);
          pVar5 = x9_62_encode_point(group,(EC_POINT *)point,ctx_00->bn_ctx);
          ctx_00->pubkey = pVar5;
          bVar2 = false;
          if (pVar5.base != (uint8_t *)0x0) {
            sVar1 = (ctx_00->pubkey).len;
            pubkey->base = (ctx_00->pubkey).base;
            pubkey->len = sVar1;
            bVar2 = true;
            iVar4 = 0;
          }
          goto LAB_0011696b;
        }
      }
      bVar2 = false;
      iVar4 = 0x203;
      goto LAB_0011696b;
    }
  }
  bVar2 = false;
LAB_0011696b:
  if (bVar2) {
    *ctx = (ptls_key_exchange_context_t *)ctx_00;
  }
  else {
    if (ctx_00 != (st_x9_62_keyex_context_t *)0x0) {
      x9_62_free_context(ctx_00);
    }
    *ctx = (ptls_key_exchange_context_t *)0x0;
    pubkey->base = (uint8_t *)0x0;
    pubkey->len = 0;
  }
  return iVar4;
}

Assistant:

static int secp256r1_create_key_exchange(ptls_key_exchange_context_t **ctx, ptls_iovec_t *pubkey)
{
    return x9_62_create_key_exchange(ctx, pubkey, NID_X9_62_prime256v1);
}